

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void ** __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::InnerMap::CreateEmptyTable(InnerMap *this,size_type n)

{
  LogMessage *pLVar1;
  pointer __s;
  Arena *local_60 [7];
  LogFinisher local_21;
  
  if (n < 8) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/map.h"
               ,0x3d1);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)local_60,"CHECK failed: n >= kMinTableSize: ");
    internal::LogFinisher::operator=(&local_21,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)local_60);
  }
  if ((n & n - 1) != 0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/map.h"
               ,0x3d2);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)local_60,"CHECK failed: (n & (n - 1)) == (0): ");
    internal::LogFinisher::operator=(&local_21,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)local_60);
  }
  local_60[0] = (this->alloc_).arena_;
  __s = internal::MapAllocator<void_*>::allocate((MapAllocator<void_*> *)local_60,n,(void *)0x0);
  memset(__s,0,n << 3);
  return __s;
}

Assistant:

void** CreateEmptyTable(size_type n) {
      GOOGLE_DCHECK(n >= kMinTableSize);
      GOOGLE_DCHECK_EQ(n & (n - 1), 0);
      void** result = Alloc<void*>(n);
      memset(result, 0, n * sizeof(result[0]));
      return result;
    }